

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O2

void __thiscall
CServerBrowserFavorites::Init
          (CServerBrowserFavorites *this,CNetClient *pNetClient,IConsole *pConsole,IEngine *pEngine,
          IConfigManager *pConfigManager)

{
  int iVar1;
  undefined4 extraout_var;
  
  this->m_pNetClient = pNetClient;
  iVar1 = (*(pConfigManager->super_IInterface)._vptr_IInterface[6])(pConfigManager);
  this->m_pConfig = (CConfig *)CONCAT44(extraout_var,iVar1);
  this->m_pConsole = pConsole;
  this->m_pEngine = pEngine;
  (*(pConfigManager->super_IInterface)._vptr_IInterface[7])(pConfigManager,ConfigSaveCallback,this);
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"add_favorite","s[hostname] ?s[password]",2,ConAddFavorite,this,
             "Add a server (optionally with password) as a favorite. Also updates password of existing favorite."
            );
  (*(this->m_pConsole->super_IInterface)._vptr_IInterface[8])
            (this->m_pConsole,"remove_favorite","s[hostname]",2,ConRemoveFavorite,this,
             "Remove a server from favorites");
  return;
}

Assistant:

void CServerBrowserFavorites::Init(CNetClient *pNetClient, IConsole *pConsole, IEngine *pEngine, IConfigManager *pConfigManager)
{
	m_pNetClient = pNetClient;
	m_pConfig = pConfigManager->Values();
	m_pConsole = pConsole;
	m_pEngine = pEngine;
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	m_pConsole->Register("add_favorite", "s[hostname] ?s[password]", CFGFLAG_CLIENT, ConAddFavorite, this, "Add a server (optionally with password) as a favorite. Also updates password of existing favorite.");
	m_pConsole->Register("remove_favorite", "s[hostname]", CFGFLAG_CLIENT, ConRemoveFavorite, this, "Remove a server from favorites");
}